

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O1

LINK_HANDLE
create_link(role link_role,SESSION_HANDLE session_handle,AMQP_MESSENGER_LINK_CONFIG *link_config,
           char *iothub_host_fqdn,char *device_id,char *module_id)

{
  MAP_HANDLE handle;
  int iVar1;
  UNIQUEID_RESULT UVar2;
  MAP_RESULT MVar3;
  STRING_HANDLE handle_00;
  LOGGER_LOG p_Var4;
  SESSION_HANDLE handle_01;
  STRING_HANDLE handle_02;
  LINK_HANDLE link;
  AMQP_VALUE map;
  AMQP_VALUE pAVar5;
  AMQP_VALUE value;
  int iVar6;
  char *pcVar7;
  STRING_HANDLE handle_03;
  char *pcVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  char **keys;
  char **values;
  AMQP_VALUE local_68;
  char **local_60;
  SESSION_HANDLE local_58;
  ulong local_50;
  AMQP_VALUE local_48;
  AMQP_MESSENGER_LINK_CONFIG *local_40;
  char **local_38;
  
  pcVar8 = (&link_config->source_suffix)[!link_role];
  local_58 = session_handle;
  handle_00 = STRING_new();
  if (handle_00 == (STRING_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      handle_00 = (STRING_HANDLE)0x0;
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"create_link_address",0x129,1,"failed creating link_address (STRING_new failed)");
      goto LAB_0013e1c4;
    }
LAB_0013e1c2:
    handle_00 = (STRING_HANDLE)0x0;
  }
  else if (module_id == (char *)0x0) {
    iVar1 = STRING_sprintf(handle_00,"amqps://%s/devices/%s/%s",iothub_host_fqdn,device_id,pcVar8);
    if (iVar1 != 0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar8 = "Failed creating the link_address (STRING_sprintf failed)";
        iVar1 = 0x13a;
        goto LAB_0013e1af;
      }
      goto LAB_0013e1ba;
    }
  }
  else {
    iVar1 = STRING_sprintf(handle_00,"amqps://%s/devices/%s/modules/%s/%s",iothub_host_fqdn,
                           device_id,module_id,pcVar8);
    if (iVar1 != 0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar8 = "Failed creating the link_address for a module (STRING_sprintf failed)";
        iVar1 = 0x131;
LAB_0013e1af:
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                  ,"create_link_address",iVar1,1,pcVar8);
      }
LAB_0013e1ba:
      STRING_delete(handle_00);
      goto LAB_0013e1c2;
    }
  }
LAB_0013e1c4:
  if (handle_00 == (STRING_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"create_link",0x227,1,
                "Failed creating the message sender (failed creating the \'link_address\')");
      return (LINK_HANDLE)0x0;
    }
    return (LINK_HANDLE)0x0;
  }
  pcVar8 = (char *)calloc(1,0x26);
  if (pcVar8 == (char *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      handle_01 = (SESSION_HANDLE)0x0;
    }
    else {
      handle_01 = (SESSION_HANDLE)0x0;
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"create_link_name",0x163,1,
                "Failed generating an unique tag (calloc failed), size:%zu",0x26);
    }
  }
  else {
    UVar2 = UniqueId_Generate(pcVar8,0x25);
    if (UVar2 == UNIQUEID_OK) {
      handle_01 = (SESSION_HANDLE)STRING_new();
      if (handle_01 == (SESSION_HANDLE)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          pcVar7 = "Failed generating an unique tag (STRING_new failed)";
          iVar1 = 0x16f;
          goto LAB_0013e36e;
        }
      }
      else {
        pcVar7 = "link-snd";
        if (link_role) {
          pcVar7 = "link-rcv";
        }
        iVar1 = STRING_sprintf((STRING_HANDLE)handle_01,"%s-%s-%s",pcVar7,device_id,pcVar8);
        if (iVar1 == 0) goto LAB_0013e37e;
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                    ,"create_link_name",0x173,1,
                    "Failed generating an unique tag (STRING_sprintf failed)");
        }
        STRING_delete((STRING_HANDLE)handle_01);
      }
LAB_0013e37b:
      handle_01 = (SESSION_HANDLE)0x0;
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013e37b;
      pcVar7 = "Failed generating an unique tag (UniqueId_Generate failed)";
      iVar1 = 0x16a;
LAB_0013e36e:
      handle_01 = (SESSION_HANDLE)0x0;
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"create_link_name",iVar1,1,pcVar7);
    }
LAB_0013e37e:
    free(pcVar8);
  }
  if (handle_01 == (SESSION_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      link = (LINK_HANDLE)0x0;
    }
    else {
      link = (LINK_HANDLE)0x0;
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"create_link",0x230,1,"Failed creating the link name");
    }
    goto LAB_0013e995;
  }
  if (link_role) {
    handle_02 = create_link_terminus_name((STRING_HANDLE)handle_01,"target");
    if (handle_02 != (STRING_HANDLE)0x0) {
      pcVar8 = STRING_c_str(handle_00);
      handle_03 = handle_02;
      goto LAB_0013e41e;
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      iVar1 = 499;
LAB_0013e48a:
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"create_link_terminus",iVar1,1,"Failed creating terminus name");
    }
LAB_0013e49a:
    pcVar7 = (char *)0x0;
    pcVar8 = (char *)0x0;
    handle_02 = (STRING_HANDLE)0x0;
  }
  else {
    handle_02 = create_link_terminus_name((STRING_HANDLE)handle_01,"source");
    if (handle_02 == (STRING_HANDLE)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        iVar1 = 0x1e5;
        goto LAB_0013e48a;
      }
      goto LAB_0013e49a;
    }
    pcVar8 = STRING_c_str(handle_02);
    handle_03 = handle_00;
LAB_0013e41e:
    pcVar7 = STRING_c_str(handle_03);
  }
  local_40 = link_config;
  if (pcVar7 == (char *)0x0 || pcVar8 == (char *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      pAVar5 = (AMQP_VALUE)0x0;
    }
    else {
      pAVar5 = (AMQP_VALUE)0x0;
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"create_link_terminus",0x200,1,
                "Failed creating link source and/or target name (source=%p, target=%p)",pcVar8,
                pcVar7);
    }
LAB_0013e5b5:
    local_68 = (AMQP_VALUE)0x0;
LAB_0013e5be:
    bVar11 = false;
  }
  else {
    pAVar5 = messaging_create_source(pcVar8);
    if (pAVar5 == (AMQP_VALUE)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013e5b5;
      local_68 = (AMQP_VALUE)0x0;
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"create_link_terminus",0x207,1,"Failed creating link source");
      goto LAB_0013e5be;
    }
    local_68 = messaging_create_target(pcVar7);
    bVar11 = true;
    if (local_68 == (AMQP_VALUE)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                  ,"create_link_terminus",0x20e,1,"Failed creating link target");
      }
      amqpvalue_destroy(pAVar5);
      pAVar5 = (AMQP_VALUE)0x0;
      goto LAB_0013e5be;
    }
  }
  STRING_delete(handle_02);
  if (bVar11) {
    pcVar8 = STRING_c_str((STRING_HANDLE)handle_01);
    link = link_create(local_58,pcVar8,link_role,pAVar5,local_68);
    if (link == (LINK_HANDLE)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013e978;
      link = (LINK_HANDLE)0x0;
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"create_link",0x23c,1,"Failed creating the AMQP link");
    }
    else {
      iVar1 = link_set_max_message_size(link,0xffffffffffffffff);
      if ((iVar1 != 0) && (p_Var4 = xlogging_get_log_function(), p_Var4 != (LOGGER_LOG)0x0)) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                  ,"create_link",0x242,1,"Failed setting link max message size.");
      }
      handle = local_40->attach_properties;
      if (handle != (MAP_HANDLE)0x0) {
        map = amqpvalue_create_map();
        if (map == (AMQP_VALUE)0x0) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                      ,"add_link_attach_properties",0x193,1,
                      "Failed to create the map for attach properties.");
          }
        }
        else {
          MVar3 = Map_GetInternals(handle,&local_60,&local_38,&local_50);
          local_48 = pAVar5;
          if (MVar3 == MAP_OK) {
            local_58 = handle_01;
            if (local_50 == 0) {
              bVar11 = true;
              iVar1 = 0;
            }
            else {
              uVar9 = 1;
              do {
                pAVar5 = amqpvalue_create_symbol(local_60[uVar9 - 1]);
                if (pAVar5 == (AMQP_VALUE)0x0) {
                  p_Var4 = xlogging_get_log_function();
                  iVar1 = 0x1ae;
                  if (p_Var4 != (LOGGER_LOG)0x0) {
                    (*p_Var4)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                              ,"add_link_attach_properties",0x1ad,1,
                              "Failed creating AMQP_VALUE For key %s.",local_60[uVar9 - 1]);
                  }
                }
                else {
                  value = amqpvalue_create_string(local_38[uVar9 - 1]);
                  if (value == (AMQP_VALUE)0x0) {
                    p_Var4 = xlogging_get_log_function();
                    iVar1 = 0x1b5;
                    if (p_Var4 != (LOGGER_LOG)0x0) {
                      (*p_Var4)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                                ,"add_link_attach_properties",0x1b4,1,
                                "Failed creating AMQP_VALUE For key %s value",local_60[uVar9 - 1]);
                    }
                  }
                  else {
                    iVar1 = amqpvalue_set_map_value(map,pAVar5,value);
                    if (iVar1 == 0) {
                      iVar1 = 0;
                    }
                    else {
                      p_Var4 = xlogging_get_log_function();
                      iVar1 = 0x1bc;
                      if (p_Var4 != (LOGGER_LOG)0x0) {
                        (*p_Var4)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                                  ,"add_link_attach_properties",0x1bb,1,
                                  "Failed adding property %s to map",local_60[uVar9 - 1]);
                      }
                    }
                    amqpvalue_destroy(value);
                  }
                  amqpvalue_destroy(pAVar5);
                }
                bVar11 = iVar1 == 0;
              } while ((bVar11) && (bVar10 = uVar9 < local_50, uVar9 = uVar9 + 1, bVar10));
            }
            handle_01 = local_58;
            if (bVar11) {
              iVar1 = link_set_attach_properties(link,map);
              if (iVar1 == 0) {
                iVar1 = 0;
              }
              else {
                p_Var4 = xlogging_get_log_function();
                iVar1 = 0x19f;
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  pcVar8 = "Failed attaching properties to link";
                  iVar6 = 0x1ca;
                  goto LAB_0013e91d;
                }
              }
            }
          }
          else {
            p_Var4 = xlogging_get_log_function();
            iVar1 = 0x19f;
            if (p_Var4 != (LOGGER_LOG)0x0) {
              pcVar8 = "failed getting user defined properties details.";
              iVar6 = 0x19e;
LAB_0013e91d:
              iVar1 = 0x19f;
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                        ,"add_link_attach_properties",iVar6,1,pcVar8);
            }
          }
          amqpvalue_destroy(map);
          pAVar5 = local_48;
          if (iVar1 == 0) goto LAB_0013e97b;
        }
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                    ,"create_link",0x248,1,"Failed setting link attach properties");
        }
        link_destroy(link);
LAB_0013e978:
        link = (LINK_HANDLE)0x0;
      }
    }
LAB_0013e97b:
    amqpvalue_destroy(pAVar5);
    amqpvalue_destroy(local_68);
  }
  else {
    link = (LINK_HANDLE)0x0;
  }
  STRING_delete((STRING_HANDLE)handle_01);
LAB_0013e995:
  STRING_delete(handle_00);
  return link;
}

Assistant:

static LINK_HANDLE create_link(role link_role, SESSION_HANDLE session_handle, AMQP_MESSENGER_LINK_CONFIG* link_config, const char* iothub_host_fqdn, const char* device_id, const char* module_id)
{
    LINK_HANDLE result = NULL;
    STRING_HANDLE link_address;

    if ((link_address = create_link_address(iothub_host_fqdn, device_id, module_id, (link_role == role_sender ? link_config->target_suffix : link_config->source_suffix))) == NULL)
    {
        LogError("Failed creating the message sender (failed creating the 'link_address')");
        result = NULL;
    }
    else
    {
        STRING_HANDLE link_name;

        if ((link_name = create_link_name(link_role, device_id)) == NULL)
        {
            LogError("Failed creating the link name");
            result = NULL;
        }
        else
        {
            AMQP_VALUE source = NULL;
            AMQP_VALUE target = NULL;

            if (create_link_terminus(link_role, link_name, link_address, &source, &target) == RESULT_OK)
            {
                if ((result = link_create(session_handle, STRING_c_str(link_name), link_role, source, target)) == NULL)
                {
                    LogError("Failed creating the AMQP link");
                }
                else
                {
                    if (link_set_max_message_size(result, MESSAGE_SENDER_MAX_LINK_SIZE) != RESULT_OK)
                    {
                        LogError("Failed setting link max message size.");
                    }

                    if (link_config->attach_properties != NULL &&
                        add_link_attach_properties(result, link_config->attach_properties) != RESULT_OK)
                    {
                        LogError("Failed setting link attach properties");
                        link_destroy(result);
                        result = NULL;
                    }
                }

                amqpvalue_destroy(source);
                amqpvalue_destroy(target);
            }

            STRING_delete(link_name);
        }

        STRING_delete(link_address);
    }

    return result;
}